

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void soplex::
     LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,bool writeZeroCoefficients)

{
  undefined8 uVar1;
  type_conflict5 tVar2;
  ostream *poVar3;
  ostream *poVar4;
  char *pcVar5;
  int iVar6;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  coeff;
  char name [16];
  
  iVar6 = 0;
  for (i = 0; i < (p_lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum; i = i + 1) {
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&coeff,p_svec,i);
    result.m_backend.data._M_elems._0_8_ = result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000
    ;
    tVar2 = boost::multiprecision::operator==(&coeff,(int *)&result);
    if (!tVar2 || writeZeroCoefficients) {
      if (iVar6 == 0) {
        poVar4 = boost::multiprecision::operator<<(p_output,&coeff);
      }
      else {
        if (iVar6 % 5 == 0) {
          std::operator<<(p_output,"\n\t");
        }
        result.m_backend.data._M_elems._0_8_ =
             result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar2 = boost::multiprecision::operator<(&coeff,(int *)&result);
        poVar4 = p_output;
        if (tVar2) {
          poVar3 = std::operator<<(p_output," - ");
          result.m_backend.data._M_elems[0] = coeff.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = coeff.m_backend.data._M_elems[1];
          uVar1 = result.m_backend.data._M_elems._0_8_;
          result.m_backend.data._M_elems[2] = coeff.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = coeff.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[8] = coeff.m_backend.data._M_elems[8];
          result.m_backend.data._M_elems[9] = coeff.m_backend.data._M_elems[9];
          result.m_backend.data._M_elems[4] = coeff.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = coeff.m_backend.data._M_elems[5];
          result.m_backend.data._M_elems[6] = coeff.m_backend.data._M_elems[6];
          result.m_backend.data._M_elems[7] = coeff.m_backend.data._M_elems[7];
          result.m_backend.exp = coeff.m_backend.exp;
          result.m_backend.neg = coeff.m_backend.neg;
          result.m_backend.fpclass = coeff.m_backend.fpclass;
          result.m_backend.prec_elem = coeff.m_backend.prec_elem;
          result.m_backend.data._M_elems[0] = coeff.m_backend.data._M_elems[0];
          if (coeff.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(coeff.m_backend.neg ^ 1);
          }
          result.m_backend.data._M_elems._0_8_ = uVar1;
          boost::multiprecision::operator<<(poVar3,&result);
        }
        else {
          poVar3 = std::operator<<(p_output," + ");
          boost::multiprecision::operator<<(poVar3,&coeff);
        }
      }
      poVar4 = std::operator<<(poVar4," ");
      pcVar5 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (p_lp,i,p_cnames,name);
      std::operator<<(poVar4,pcVar5);
      iVar6 = iVar6 + 1;
    }
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}